

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O1

bool Js::JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
               (PropertyOperationFlags flags,ScriptContext *scriptContext,PCWSTR varName)

{
  bool bVar1;
  int32 hCode;
  
  if ((flags & (PropertyOperation_ThrowOnDeleteIfNotConfig|PropertyOperation_StrictMode)) !=
      PropertyOperation_None) {
    bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar1) {
      hCode = -0x7ff5e9de;
      if ((flags >> 10 & 1) == 0) {
        hCode = -0x7ff5ec4f;
      }
      ThrowTypeError(scriptContext,hCode,varName);
    }
  }
  return (flags & (PropertyOperation_ThrowOnDeleteIfNotConfig|PropertyOperation_StrictMode)) !=
         PropertyOperation_None;
}

Assistant:

bool JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(PropertyOperationFlags flags, ScriptContext* scriptContext, PCWSTR varName)
    {
        bool isNonConfigThrow = (flags & PropertyOperation_ThrowOnDeleteIfNotConfig) == PropertyOperation_ThrowOnDeleteIfNotConfig;

        if (isNonConfigThrow || flags & PropertyOperation_StrictMode)
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, isNonConfigThrow ? JSERR_CantDeleteNonConfigProp : JSERR_CantDeleteExpr, varName);
            }
            return true;
        }
        return false;
    }